

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Token * __thiscall wabt::WastParser::GetToken(Token *__return_storage_ptr__,WastParser *this)

{
  bool bVar1;
  reference __src;
  Token local_50;
  WastParser *local_10;
  WastParser *this_local;
  
  local_10 = this;
  bVar1 = CircularArray<wabt::Token,_2UL>::empty(&this->tokens_);
  if (bVar1) {
    WastLexer::GetToken(&local_50,this->lexer_,this);
    CircularArray<wabt::Token,_2UL>::push_back(&this->tokens_,&local_50);
  }
  __src = CircularArray<wabt::Token,_2UL>::front(&this->tokens_);
  memcpy(__return_storage_ptr__,__src,0x40);
  return __return_storage_ptr__;
}

Assistant:

Token WastParser::GetToken() {
  if (tokens_.empty()) {
    tokens_.push_back(lexer_->GetToken(this));
  }
  return tokens_.front();
}